

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O0

char * ContentTypeForFilename(char *filename,char *prevtype)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  uint local_24;
  char *pcStack_20;
  uint i;
  char *contenttype;
  char *prevtype_local;
  char *filename_local;
  
  pcStack_20 = prevtype;
  if (prevtype == (char *)0x0) {
    pcStack_20 = "application/octet-stream";
  }
  if (filename != (char *)0x0) {
    for (local_24 = 0; local_24 < 6; local_24 = local_24 + 1) {
      sVar2 = strlen(filename);
      sVar3 = strlen(ContentTypeForFilename::ctts[local_24].extension);
      if (sVar3 <= sVar2) {
        sVar2 = strlen(filename);
        sVar3 = strlen(ContentTypeForFilename::ctts[local_24].extension);
        iVar1 = curl_strequal(filename + (sVar2 - sVar3),
                              ContentTypeForFilename::ctts[local_24].extension);
        if (iVar1 != 0) {
          return ContentTypeForFilename::ctts[local_24].type;
        }
      }
    }
  }
  return pcStack_20;
}

Assistant:

static const char *ContentTypeForFilename(const char *filename,
                                          const char *prevtype)
{
  const char *contenttype = NULL;
  unsigned int i;
  /*
   * No type was specified, we scan through a few well-known
   * extensions and pick the first we match!
   */
  struct ContentType {
    const char *extension;
    const char *type;
  };
  static const struct ContentType ctts[]={
    {".gif",  "image/gif"},
    {".jpg",  "image/jpeg"},
    {".jpeg", "image/jpeg"},
    {".txt",  "text/plain"},
    {".html", "text/html"},
    {".xml", "application/xml"}
  };

  if(prevtype)
    /* default to the previously set/used! */
    contenttype = prevtype;
  else
    contenttype = HTTPPOST_CONTENTTYPE_DEFAULT;

  if(filename) { /* in case a NULL was passed in */
    for(i=0; i<sizeof(ctts)/sizeof(ctts[0]); i++) {
      if(strlen(filename) >= strlen(ctts[i].extension)) {
        if(strequal(filename +
                    strlen(filename) - strlen(ctts[i].extension),
                    ctts[i].extension)) {
          contenttype = ctts[i].type;
          break;
        }
      }
    }
  }
  /* we have a contenttype by now */
  return contenttype;
}